

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  char cVar2;
  int iVar3;
  ParamDictPrivate *pPVar4;
  long lVar5;
  Mat *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar6;
  int iVar7;
  float *ptr;
  long lVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  size_t sStack_1b0;
  int id;
  allocator<char> local_1a1;
  DataReader *local_1a0;
  char vstr [16];
  char comma [4];
  int len;
  size_type sStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  int v;
  char vstr_1 [16];
  
  local_1a0 = dr;
  clear(this);
  id = 0;
  do {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len;
    iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%d=",&id);
    if (iVar3 != 1) {
      return 0;
    }
    if (id < -0x5b03) {
      iVar3 = -0x5b04 - id;
      bVar10 = (uint)id < 0xffffa4dd;
      id = iVar3;
      if (bVar10) {
LAB_0013c00c:
        fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
                (ulong)(uint)id,0x20);
        fputc(10,_stderr);
        return -1;
      }
      _len = _len & 0xffffffff00000000;
      iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%d",__return_storage_ptr__);
      if (iVar3 == 1) {
        Mat::create(&this->d->params[id].v,len,4,(Allocator *)0x0);
        lVar5 = 0;
        lVar8 = 0;
        while( true ) {
          if (len <= lVar8) break;
          iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,",%15[^,\n ]",vstr_1);
          if (iVar3 != 1) {
            fwrite("ParamDict read array element failed",0x23,1,_stderr);
LAB_0013bf80:
            fputc(10,_stderr);
            bVar10 = true;
            goto LAB_0013bf36;
          }
          bVar10 = vstr_is_float(vstr_1);
          pPVar4 = this->d;
          lVar9 = (long)id;
          pvVar1 = pPVar4->params[lVar9].v.data;
          if (bVar10) {
            fVar11 = vstr_to_float(vstr_1);
            *(float *)((long)pvVar1 + lVar5) = fVar11;
            iVar3 = 6;
          }
          else {
            iVar3 = __isoc99_sscanf(vstr_1,"%d",(long)pvVar1 + lVar5);
            if (iVar3 != 1) {
              fwrite("ParamDict parse array element failed",0x24,1,_stderr);
              goto LAB_0013bf80;
            }
            pPVar4 = this->d;
            lVar9 = (long)id;
            iVar3 = 5;
          }
          pPVar4->params[lVar9].type = iVar3;
          lVar8 = lVar8 + 1;
          lVar5 = lVar5 + 4;
        }
        bVar10 = false;
      }
      else {
        pcVar6 = "ParamDict read array length failed";
        sStack_1b0 = 0x22;
LAB_0013bf1f:
        fwrite(pcVar6,sStack_1b0,1,_stderr);
        fputc(10,_stderr);
LAB_0013bf33:
        bVar10 = true;
      }
    }
    else {
      if (0x1f < id) goto LAB_0013c00c;
      iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%15[^,\n ]",vstr);
      cVar2 = vstr[0];
      if (iVar3 != 1) {
        pcVar6 = "ParamDict read value failed";
        sStack_1b0 = 0x1b;
        goto LAB_0013bf1f;
      }
      iVar7 = (int)vstr[0];
      iVar3 = isalpha(iVar7);
      if ((iVar7 == 0x22) || (iVar3 != 0)) {
        pcVar6 = "%255[^\n ]";
        if (cVar2 == '\"') {
          pcVar6 = "%255[^\"\n]\"";
        }
        iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,pcVar6,vstr_1);
        if (iVar3 == 1) {
          if (vstr[0] == '\"') {
            std::__cxx11::string::string<std::allocator<char>>((string *)&v,vstr + 1,&local_1a1);
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           vstr_1);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>((string *)&v,vstr,&local_1a1);
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           vstr_1);
          }
          std::__cxx11::string::operator=
                    ((string *)&this->d->params[id].s,(string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v;
        }
        else {
          if (vstr[0] == '\"') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,vstr + 1,(allocator<char> *)&v);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,vstr,(allocator<char> *)&v);
          }
          std::__cxx11::string::operator=
                    ((string *)&this->d->params[id].s,(string *)__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        pPVar4 = this->d;
        lVar5 = (long)id;
        if (pPVar4->params[lVar5].s._M_dataplus._M_p[pPVar4->params[lVar5].s._M_string_length - 1]
            == '\"') {
          std::__cxx11::string::resize((ulong)&pPVar4->params[lVar5].s);
          pPVar4 = this->d;
          lVar5 = (long)id;
        }
        pPVar4->params[lVar5].type = 7;
        bVar10 = false;
        goto LAB_0013bf36;
      }
      bVar10 = vstr_is_float(vstr);
      iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%1[,]",comma);
      if (iVar3 == 1) {
        vstr_1[0] = '\0';
        vstr_1[1] = '\0';
        vstr_1[2] = '\0';
        vstr_1[3] = '\0';
        vstr_1[4] = '\0';
        vstr_1[5] = '\0';
        vstr_1[6] = '\0';
        vstr_1[7] = '\0';
        vstr_1[8] = '\0';
        vstr_1[9] = '\0';
        vstr_1[10] = '\0';
        vstr_1[0xb] = '\0';
        vstr_1[0xc] = '\0';
        vstr_1[0xd] = '\0';
        vstr_1[0xe] = '\0';
        vstr_1[0xf] = '\0';
        _len = (pointer)0x0;
        sStack_170 = 0;
        local_168._M_allocated_capacity = 0;
        if (bVar10) {
          v = (int)vstr_to_float(vstr);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)vstr_1,(float *)&v);
        }
        else {
          v = 0;
          iVar3 = __isoc99_sscanf(vstr,"%d",&v);
          if (iVar3 != 1) {
LAB_0013bfb2:
            fwrite("ParamDict parse value failed",0x1c,1,_stderr);
            fputc(10,_stderr);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)__return_storage_ptr__);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)vstr_1);
            goto LAB_0013bf33;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,&v);
        }
        do {
          iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%15[^,\n ]",vstr);
          if (iVar3 != 1) break;
          if (bVar10) {
            v = (int)vstr_to_float(vstr);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      ((vector<float,_std::allocator<float>_> *)vstr_1,(float *)&v);
          }
          else {
            v = 0;
            iVar3 = __isoc99_sscanf(vstr,"%d",&v);
            if (iVar3 != 1) goto LAB_0013bfb2;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,&v);
          }
          iVar3 = (*local_1a0->_vptr_DataReader[2])(local_1a0,"%1[,]",comma);
        } while (iVar3 == 1);
        this_00 = &this->d->params[id].v;
        if (bVar10) {
          Mat::create(this_00,(int)((ulong)(vstr_1._8_8_ - vstr_1._0_8_) >> 2),4,(Allocator *)0x0);
          memcpy(this->d->params[id].v.data,(void *)vstr_1._0_8_,vstr_1._8_8_ - vstr_1._0_8_);
          iVar3 = 6;
        }
        else {
          Mat::create(this_00,(int)(sStack_170 - (long)_len >> 2),4,(Allocator *)0x0);
          memcpy(this->d->params[id].v.data,_len,sStack_170 - (long)_len);
          iVar3 = 5;
        }
        this->d->params[id].type = iVar3;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)__return_storage_ptr__);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)vstr_1);
      }
      else {
        if (bVar10) {
          fVar11 = vstr_to_float(vstr);
          this->d->params[id].field_1.f = fVar11;
          iVar3 = 3;
        }
        else {
          iVar7 = __isoc99_sscanf(vstr,"%d",&this->d->params[id].field_1);
          iVar3 = 2;
          if (iVar7 != 1) {
            pcVar6 = "ParamDict parse value failed";
            sStack_1b0 = 0x1c;
            goto LAB_0013bf1f;
          }
        }
        this->d->params[id].type = iVar3;
      }
      bVar10 = false;
    }
LAB_0013bf36:
    if (bVar10) {
      return -1;
    }
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    // 0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0
    // 3=0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            // old style array
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }

            continue;
        }

        char vstr[16];
        char comma[4];
        int nscan = dr.scan("%15[^,\n ]", vstr);
        if (nscan != 1)
        {
            NCNN_LOGE("ParamDict read value failed");
            return -1;
        }

        bool is_string = vstr_is_string(vstr);
        if (is_string)
        {
            // scan the remaining string
            char vstr2[256];
            vstr2[241] = '\0'; // max 255 = 15 + 240
            if (vstr[0] == '\"')
            {
                nscan = dr.scan("%255[^\"\n]\"", vstr2);
            }
            else
            {
                nscan = dr.scan("%255[^\n ]", vstr2);
            }
            if (nscan == 1)
            {
                if (vstr2[241] != '\0')
                {
                    NCNN_LOGE("string too long (id=%d)", id);
                    return -1;
                }

                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]) + vstr2;
                else
                    d->params[id].s = std::string(vstr) + vstr2;
            }
            else
            {
                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]);
                else
                    d->params[id].s = std::string(vstr);
            }

            if (d->params[id].s[d->params[id].s.size() - 1] == '\"')
                d->params[id].s.resize(d->params[id].s.size() - 1);

            d->params[id].type = 7;

            continue;
        }

        bool is_float = vstr_is_float(vstr);

        nscan = dr.scan("%1[,]", comma);
        is_array = nscan == 1;

        if (is_array)
        {
            std::vector<float> af;
            std::vector<int> ai;

            if (is_float)
            {
                af.push_back(vstr_to_float(vstr));
            }
            else
            {
                int v = 0;
                nscan = sscanf(vstr, "%d", &v);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }

                ai.push_back(v);
            }

            while (1)
            {
                nscan = dr.scan("%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    break;
                }

                if (is_float)
                {
                    af.push_back(vstr_to_float(vstr));
                }
                else
                {
                    int v = 0;
                    nscan = sscanf(vstr, "%d", &v);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse value failed");
                        return -1;
                    }

                    ai.push_back(v);
                }

                nscan = dr.scan("%1[,]", comma);
                if (nscan != 1)
                {
                    break;
                }
            }

            if (is_float)
            {
                d->params[id].v.create((int)af.size());
                memcpy(d->params[id].v.data, af.data(), af.size() * 4);
            }
            else
            {
                d->params[id].v.create((int)ai.size());
                memcpy(d->params[id].v.data, ai.data(), ai.size() * 4);
            }

            d->params[id].type = is_float ? 6 : 5;
        }
        else
        {
            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}